

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint __thiscall
ON_SubDEdgeChain::RemoveEdges(ON_SubDEdgeChain *this,ON_SubDEdge *first_edge,ON_SubDEdge *last_edge)

{
  ON_UniqueTester *this_00;
  uint uVar1;
  Block *memblock;
  Block *pBVar2;
  uint uVar3;
  ulong uVar4;
  ON_SubDEdgePtr *pOVar5;
  ON_SubDVertex *pOVar6;
  ON_SubDVertex *x;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ON__UINT_PTR x_00;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  
  uVar1 = (this->m_edge_chain).m_count;
  uVar4 = (ulong)uVar1;
  uVar13 = 0;
  if (uVar1 != 0 && first_edge != (ON_SubDEdge *)0x0) {
    uVar13 = 0;
    do {
      if ((ON_SubDEdge *)((this->m_edge_chain).m_a[uVar13].m_ptr & 0xfffffffffffffff8) == first_edge
         ) goto LAB_005f769d;
      uVar13 = uVar13 + 1;
    } while (uVar1 != (uint)uVar13);
    uVar13 = (ulong)uVar1;
  }
LAB_005f769d:
  uVar12 = (uint)uVar13;
  uVar9 = uVar1;
  if (last_edge != (ON_SubDEdge *)0x0) {
    uVar3 = uVar1;
    if (uVar12 < uVar1) {
      uVar3 = uVar12;
    }
    uVar10 = uVar1 + 1;
    do {
      uVar9 = uVar3;
      if (uVar4 <= (uVar13 & 0xffffffff)) break;
      lVar8 = uVar4 - 1;
      uVar4 = uVar4 - 1;
      uVar9 = uVar10 - 1;
      uVar10 = uVar9;
    } while ((ON_SubDEdge *)((this->m_edge_chain).m_a[lVar8].m_ptr & 0xfffffffffffffff8) !=
             last_edge);
  }
  uVar11 = uVar9 - uVar12;
  uVar10 = uVar1 - uVar11;
  uVar3 = 0;
  if (uVar11 <= uVar1 && uVar10 != 0) {
    if (uVar12 < uVar9 && uVar12 != 0) {
      pOVar5 = (this->m_edge_chain).m_a;
      lVar8 = (ulong)uVar9 - (uVar13 & 0xffffffff);
      do {
        pOVar5->m_ptr = pOVar5[uVar13 & 0xffffffff].m_ptr;
        pOVar5 = pOVar5 + 1;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    if ((-1 < (int)uVar11) && ((int)uVar11 <= (this->m_edge_chain).m_capacity)) {
      (this->m_edge_chain).m_count = uVar11;
    }
    memblock = (this->m_unique_tester).m_block_list;
    (this->m_unique_tester).m_sorted_count = 0;
    (this->m_unique_tester).m_block_list = (Block *)0x0;
    while (memblock != (Block *)0x0) {
      pBVar2 = memblock->m_next;
      onfree(memblock);
      memblock = pBVar2;
    }
    this_00 = &this->m_unique_tester;
    if (uVar9 != uVar12) {
      uVar4 = 0;
      do {
        ON_UniqueTester::AddToList
                  (this_00,(this->m_edge_chain).m_a[uVar4].m_ptr & 0xfffffffffffffff8);
        uVar13 = (this->m_edge_chain).m_a[uVar4].m_ptr;
        uVar7 = uVar13 & 0xfffffffffffffff8;
        if (uVar7 == 0) {
          x_00 = 0;
        }
        else {
          x_00 = *(ON__UINT_PTR *)(uVar7 + 0x80 + (ulong)((uint)uVar13 & 1) * 8);
        }
        ON_UniqueTester::AddToList(this_00,x_00);
        uVar4 = uVar4 + 1;
      } while (uVar11 != uVar4);
    }
    pOVar6 = Vertex(this,0);
    x = Vertex(this,(this->m_edge_chain).m_count);
    uVar3 = uVar10;
    if (pOVar6 != x) {
      ON_UniqueTester::AddToList(this_00,(ON__UINT_PTR)x);
    }
  }
  return uVar3;
}

Assistant:

unsigned int ON_SubDEdgeChain::RemoveEdges(
  const ON_SubDEdge* first_edge,
  const ON_SubDEdge* last_edge
) 
{
  unsigned int count0 = m_edge_chain.UnsignedCount();
  unsigned int i0 = 0;
  unsigned int i1 = count0;
  if (nullptr != first_edge)
  {
    while (i0 < count0 && first_edge != m_edge_chain[i0].Edge())
      ++i0;
  }
  if (nullptr != last_edge)
  {
    while (i1 > i0 && last_edge != m_edge_chain[i1 - 1].Edge())
      --i1;
  }

  const unsigned int count1 = i1 - i0;
  if (count1 >= count0)
    return 0;

  if (i0 > 0)
  {
    for (unsigned int i = i0; i < i1; i++)
      m_edge_chain[i - i0] = m_edge_chain[i];
  }

  m_edge_chain.SetCount(count1);
  m_unique_tester.ClearList();
  for (unsigned int i = 0; i < count1; i++)
  {
    m_unique_tester.AddToList((ON__UINT_PTR)m_edge_chain[i].Edge());
    m_unique_tester.AddToList((ON__UINT_PTR)m_edge_chain[i].RelativeVertex(0));
  }
  if ( FirstVertex() != LastVertex() )
    m_unique_tester.AddToList((ON__UINT_PTR)LastVertex());

  return count0 - count1;
}